

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_should_not_parse_to_deeply_nested_jsons(void)

{
  long lVar1;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  ulong local_410;
  size_t position;
  char deep_json [1001];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_410 = 0; local_410 < 0x3e9; local_410 = local_410 + 1) {
    deep_json[local_410 - 8] = '[';
  }
  deep_json[0x3e0] = '\0';
  pcVar2 = cJSON_Parse((char *)&position);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail("To deep JSONs should not be parsed.",0xc5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_should_not_parse_to_deeply_nested_jsons(void)
{
    char deep_json[CJSON_NESTING_LIMIT + 1];
    size_t position = 0;

    for (position = 0; position < sizeof(deep_json); position++)
    {
        deep_json[position] = '[';
    }
    deep_json[sizeof(deep_json) - 1] = '\0';

    TEST_ASSERT_NULL_MESSAGE(cJSON_Parse(deep_json), "To deep JSONs should not be parsed.");
}